

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O0

type boost::make_shared<std::ofstream>(void)

{
  sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_> *this;
  ofstream *this_00;
  shared_count extraout_RDX;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *in_RDI;
  type tVar1;
  basic_ofstream<char,_std::char_traits<char>_> *pt2;
  void *pv;
  sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_> *pd;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> pt;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffff98;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *this_01;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> local_18;
  
  this_01 = in_RDI;
  shared_ptr<std::ofstream>::
  shared_ptr<std::ofstream,boost::detail::sp_inplace_tag<boost::detail::sp_ms_deleter<std::ofstream>>>
            (&local_18,0);
  this = (sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
         shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::
         _internal_get_untyped_deleter(this_01);
  this_00 = (ofstream *)
            detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>::address
                      (this);
  std::ofstream::ofstream(this_00);
  detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>::set_initialized(this);
  detail::sp_enable_shared_from_this(&local_18,this_00);
  shared_ptr<std::ofstream>::shared_ptr<std::ofstream>
            (this_01,in_stack_ffffffffffffff98,(element_type *)0x2563a1);
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x2563ab);
  tVar1.pn.pi_ = extraout_RDX.pi_;
  tVar1.px = (element_type *)in_RDI;
  return tVar1;
}

Assistant:

typename boost::detail::sp_if_not_array< T >::type make_shared( Args && ... args )
{
    boost::shared_ptr< T > pt( static_cast< T* >( 0 ), BOOST_SP_MSD( T ) );

    boost::detail::sp_ms_deleter< T > * pd = static_cast<boost::detail::sp_ms_deleter< T > *>( pt._internal_get_untyped_deleter() );

    void * pv = pd->address();

    ::new( pv ) T( boost::detail::sp_forward<Args>( args )... );
    pd->set_initialized();

    T * pt2 = static_cast< T* >( pv );

    boost::detail::sp_enable_shared_from_this( &pt, pt2, pt2 );
    return boost::shared_ptr< T >( pt, pt2 );
}